

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetworkClassifier *nn)

{
  string *psVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Type *a;
  Type *b;
  LogMessage *pLVar7;
  NeuralNetworkClassifier *pNVar8;
  undefined8 *puVar9;
  Rep *pRVar10;
  long *plVar11;
  long *plVar12;
  NetworkUpdateParameters *pNVar13;
  long lVar14;
  FeatureType *b_00;
  char *pcVar15;
  FeatureType *a_00;
  int iVar16;
  long lVar17;
  RepeatedPtrFieldBase *this;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  string trainingInputTarget;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string err;
  string targetTypeString;
  string typeString;
  string target;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  int *local_278;
  iterator iStack_270;
  int *local_268;
  NeuralNetworkClassifier *local_260;
  string local_258;
  ulong local_238;
  RepeatedPtrFieldBase *local_230;
  RepeatedPtrFieldBase *local_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  undefined1 *local_160;
  size_t local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  LogMessage local_140;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Result local_c8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_260 = nn;
  CoreML::Result::Result(&local_c8);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)0x0,0x322b39);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
    goto LAB_00297ede;
  }
  local_278 = (int *)0x0;
  iStack_270._M_current = (int *)0x0;
  local_268 = (int *)0x0;
  local_140.level_ = LOGLEVEL_INFO;
  iVar16 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar16) {
    local_230 = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
    do {
      a = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                    (local_230,local_140.level_);
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_00297542:
        if (iStack_270._M_current == local_268) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_278,iStack_270,(int *)&local_140);
        }
        else {
          *iStack_270._M_current = local_140.level_;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
      }
      else {
        iVar16 = 1;
        bVar19 = false;
        do {
          b = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar16 + -1);
          bVar4 = CoreML::Specification::isEquivalent(a,b);
          if (bVar4) {
            bVar19 = true;
          }
          bVar20 = iVar16 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_;
          iVar16 = iVar16 + 1;
        } while (bVar20 && !bVar4);
        if (!bVar19) goto LAB_00297542;
      }
      local_140.level_ = local_140.level_ + LOGLEVEL_WARNING;
      iVar16 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    } while ((int)local_140.level_ < iVar16);
  }
  if ((long)iStack_270._M_current - (long)local_278 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_258,0,(char *)local_258._M_string_length,0x322ba8);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
  }
  else if ((long)iStack_270._M_current - (long)local_278 >> 2 == (long)iVar16) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_258,0,(char *)local_258._M_string_length,0x322c0b);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
  }
  else {
    local_160 = &local_150;
    local_158 = 0;
    local_150 = 0;
    pNVar13 = local_260->updateparams_;
    if (pNVar13 == (NetworkUpdateParameters *)0x0) {
      pNVar13 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((pNVar13->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar7 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar7);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar16 = (pNVar13->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (*(int *)((long)((pNVar13->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24)
        == 10) {
      if (iVar16 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_140,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           (&local_140,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage(&local_140);
      }
      if (*(int *)((long)((pNVar13->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) != 10) {
        CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
      }
LAB_002977ea:
      std::__cxx11::string::_M_assign((string *)&local_160);
    }
    else {
      if (iVar16 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      if (*(int *)((long)((pNVar13->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) == 0xb) {
        if ((pNVar13->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_140,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             (&local_140,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_298,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage(&local_140);
        }
        if (*(int *)((long)((pNVar13->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24) != 0xb) {
          CoreML::Specification::MeanSquaredErrorLossLayer::default_instance();
        }
        goto LAB_002977ea;
      }
    }
    bVar19 = iStack_270._M_current != local_278;
    if (iStack_270._M_current == local_278) {
      bVar4 = false;
    }
    else {
      this = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
      uVar18 = 0;
      bVar4 = false;
      local_228 = this;
      do {
        local_238 = uVar18;
        pNVar8 = (NeuralNetworkClassifier *)
                 google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (this,local_278[uVar18]);
        psVar1 = (string *)(pNVar8->layers_).super_RepeatedPtrFieldBase.arena_;
        pcVar2 = (psVar1->_M_dataplus)._M_p;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar2,pcVar2 + psVar1->_M_string_length);
        psVar1 = (modelDescription->predictedfeaturename_).ptr_;
        if ((local_298._M_string_length == psVar1->_M_string_length) &&
           ((local_298._M_string_length == 0 ||
            (iVar16 = bcmp(local_298._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,
                           local_298._M_string_length), iVar16 == 0)))) {
          pRVar10 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
          local_230 = (RepeatedPtrFieldBase *)pRVar10->elements;
          if (pRVar10 == (Rep *)0x0) {
            local_230 = (RepeatedPtrFieldBase *)0x0;
          }
          lVar14 = (long)(modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
          local_260 = pNVar8;
          if (lVar14 != 0) {
            lVar17 = 0;
            do {
              lVar3 = *(long *)((long)&local_230->arena_ + lVar17);
              iVar16 = 0;
              bVar20 = false;
              if (local_298._M_string_length == (*(undefined8 **)(lVar3 + 0x10))[1]) {
                if (local_298._M_string_length == 0) {
                  bVar20 = true;
                }
                else {
                  iVar6 = bcmp(local_298._M_dataplus._M_p,(void *)**(undefined8 **)(lVar3 + 0x10),
                               local_298._M_string_length);
                  bVar20 = iVar6 == 0;
                }
              }
              if (bVar20) {
                a_00 = (FeatureType *)(local_260->layers_).super_RepeatedPtrFieldBase.rep_;
                if (a_00 == (FeatureType *)0x0) {
                  a_00 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                b_00 = *(FeatureType **)(lVar3 + 0x20);
                if (b_00 == (FeatureType *)0x0) {
                  b_00 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                bVar5 = CoreML::Specification::operator==(a_00,b_00);
                if (bVar5) {
                  iVar16 = 0xb;
                  bVar4 = true;
                }
                else {
                  puVar9 = *(undefined8 **)(lVar3 + 0x20);
                  if (puVar9 == (undefined8 *)0x0) {
                    puVar9 = &CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar5 = *(int *)((long)puVar9 + 0x24) == 1;
                  pcVar15 = "String";
                  if (bVar5) {
                    pcVar15 = "Int64";
                  }
                  local_180[0] = local_170;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_180,pcVar15,pcVar15 + (6 - (ulong)bVar5));
                  pRVar10 = (local_260->layers_).super_RepeatedPtrFieldBase.rep_;
                  if (pRVar10 == (Rep *)0x0) {
                    pRVar10 = (Rep *)&CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar5 = *(int *)&pRVar10[2].field_0x4 == 1;
                  pcVar15 = "String";
                  if (bVar5) {
                    pcVar15 = "Int64";
                  }
                  local_1a0[0] = local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a0,pcVar15,pcVar15 + (6 - (ulong)bVar5));
                  std::operator+(&local_e8,"The type of the training input provided: ",&local_298);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_e8);
                  plVar12 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar12) {
                    local_1b0 = *plVar12;
                    lStack_1a8 = plVar11[3];
                    local_1c0 = &local_1b0;
                  }
                  else {
                    local_1b0 = *plVar12;
                    local_1c0 = (long *)*plVar11;
                  }
                  local_1b8 = plVar11[1];
                  *plVar11 = (long)plVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_1c0,(ulong)local_1a0[0]);
                  local_220 = &local_210;
                  plVar12 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar12) {
                    local_210 = *plVar12;
                    lStack_208 = plVar11[3];
                  }
                  else {
                    local_210 = *plVar12;
                    local_220 = (long *)*plVar11;
                  }
                  local_218 = plVar11[1];
                  *plVar11 = (long)plVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar12 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar12) {
                    local_1f0 = *plVar12;
                    lStack_1e8 = plVar11[3];
                  }
                  else {
                    local_1f0 = *plVar12;
                    local_200 = (long *)*plVar11;
                  }
                  local_1f8 = plVar11[1];
                  *plVar11 = (long)plVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_200,(ulong)local_180[0]);
                  local_1e0 = &local_1d0;
                  plVar12 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar12) {
                    local_1d0 = *plVar12;
                    lStack_1c8 = plVar11[3];
                  }
                  else {
                    local_1d0 = *plVar12;
                    local_1e0 = (long *)*plVar11;
                  }
                  local_1d8 = plVar11[1];
                  *plVar11 = (long)plVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar12 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar12) {
                    local_f8 = *plVar12;
                    lStack_f0 = plVar11[3];
                    local_108 = &local_f8;
                  }
                  else {
                    local_f8 = *plVar12;
                    local_108 = (long *)*plVar11;
                  }
                  local_100 = plVar11[1];
                  *plVar11 = (long)plVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_258,(string *)&local_108);
                  if (local_108 != &local_f8) {
                    operator_delete(local_108,local_f8 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  CoreML::Result::Result
                            (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258
                            );
                  if (local_1a0[0] != local_190) {
                    operator_delete(local_1a0[0],local_190[0] + 1);
                  }
                  if (local_180[0] != local_170) {
                    operator_delete(local_180[0],local_170[0] + 1);
                  }
                  iVar16 = 1;
                }
              }
              this = local_228;
              if (bVar20) goto LAB_00297de5;
              lVar17 = lVar17 + 8;
            } while (lVar14 * 8 != lVar17);
          }
          iVar16 = 0xb;
LAB_00297de5:
          uVar18 = local_238;
          if (iVar16 == 0xb) goto LAB_00297886;
        }
        else {
LAB_00297886:
          uVar18 = local_238;
          iVar16 = 0;
          if (local_158 == local_298._M_string_length) {
            if (local_158 == 0) {
              bVar4 = true;
            }
            else {
              iVar6 = bcmp(local_160,local_298._M_dataplus._M_p,local_158);
              if (iVar6 == 0) {
                bVar4 = true;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (iVar16 != 0) break;
        uVar18 = uVar18 + 1;
        bVar19 = uVar18 < (ulong)((long)iStack_270._M_current - (long)local_278 >> 2);
      } while (bVar19);
    }
    if (!bVar19) {
      if (bVar4) {
        CoreML::Result::Result(__return_storage_ptr__);
      }
      else {
        std::operator+(&local_298,
                       "The training inputs don\'t include the target of the classifier: ",
                       (modelDescription->predictedfeaturename_).ptr_);
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
      }
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
    }
  }
  if (local_278 != (int *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
LAB_00297ede:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}